

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Matcher::PopAssertion
          (Matcher *this,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,bool succeeded)

{
  char cVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Program *pPVar7;
  int i;
  uint uVar8;
  long lVar9;
  uint *local_48;
  
  uVar6 = (assertionStack->
          super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  if (uVar6 == 0) {
LAB_00ef2a4e:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xce,"(info != 0)","info != 0");
    if (!bVar4) goto LAB_00ef2deb;
    *puVar5 = 0;
    uVar6 = (assertionStack->
            super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    local_48 = (uint *)0x0;
  }
  else {
    if (uVar6 < 0x10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xf0,"(size <= nextTop)","size <= nextTop");
      if (!bVar4) goto LAB_00ef2deb;
      *puVar5 = 0;
    }
    if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>)
        .super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar4) goto LAB_00ef2deb;
      *puVar5 = 0;
    }
    uVar6 = (assertionStack->
            super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    local_48 = (uint *)((long)&((assertionStack->
                                super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>
                                ).super_ContinuousPageStack<1UL>.pageAllocation)->pageCount + uVar6)
    ;
    if (local_48 == (uint *)0x0) goto LAB_00ef2a4e;
  }
  if (uVar6 != 0) {
    if (uVar6 < 0x10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfd,"(nextTop >= size)","nextTop >= size");
      if (!bVar4) goto LAB_00ef2deb;
      *puVar5 = 0;
      uVar6 = (assertionStack->
              super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
    }
    (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = uVar6 - 0x10;
    if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>)
        .super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar4) goto LAB_00ef2deb;
      *puVar5 = 0;
    }
  }
  uVar6 = (ulong)*local_48;
  pPVar7 = (this->program).ptr;
  if ((ulong)(pPVar7->rep).insts.instsLen < uVar6 + 0xe) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar4) goto LAB_00ef2deb;
    *puVar5 = 0;
    pPVar7 = (this->program).ptr;
  }
  lVar9 = *(long *)&pPVar7->rep;
  if (*(char *)(lVar9 + uVar6) != 'b') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar4) goto LAB_00ef2deb;
    *puVar5 = 0;
    lVar9 = *(long *)&((this->program).ptr)->rep;
  }
  if (this->w != (DebugWriter *)0x0) {
    DebugWriter::PrintEOL(this->w,L"POP TO %llu",*(undefined8 *)(local_48 + 2));
  }
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
            (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>,
             *(size_t *)(local_48 + 2));
  if ((succeeded) && (*(char *)(lVar9 + 9 + uVar6) == '\x01')) {
    uVar8 = *(uint *)(lVar9 + 1 + uVar6);
    iVar2 = *(int *)(lVar9 + 5 + uVar6);
    if ((int)uVar8 <= iVar2) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if (((int)uVar8 < 0) || (((this->program).ptr)->numGroups <= uVar8)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar4) goto LAB_00ef2deb;
          *puVar5 = 0;
        }
        (this->groupInfos).ptr[(int)uVar8].length = 0xffffffff;
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 <= iVar2);
    }
  }
  cVar1 = *(char *)(lVar9 + 9 + uVar6);
  if ((bool)cVar1 != succeeded) {
    *inputOffset = local_48[1];
    uVar8 = *(uint *)(lVar9 + 10 + uVar6);
    pPVar7 = (this->program).ptr;
    if ((pPVar7->rep).insts.instsLen <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar4) {
LAB_00ef2deb:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
      pPVar7 = (this->program).ptr;
    }
    *instPointer = (pPVar7->rep).insts.insts.ptr + uVar8;
  }
  return (bool)cVar1 != succeeded;
}

Assistant:

inline bool Matcher::PopAssertion(CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, bool succeeded)
    {
        AssertionInfo* info = assertionStack.Top();
        Assert(info != 0);
        assertionStack.Pop();
        BeginAssertionInst* begin = L2I(BeginAssertion, info->beginLabel);

        // Cut the existing continuations (we never backtrack into an assertion)
        // NOTE: We don't include the effective pops in the stats
#if ENABLE_REGEX_CONFIG_OPTIONS
        if (w != 0)
        {
            w->PrintEOL(_u("POP TO %llu"), (unsigned long long)info->contStackPosition);
        }
#endif
        contStack.PopTo(info->contStackPosition);

        // succeeded  isNegation  action
        // ---------  ----------  ----------------------------------------------------------------------------------
        // false      false       Fail into outer continuations (inner group bindings will have been undone)
        // true       false       Jump to next label (inner group bindings are now frozen)
        // false      true        Jump to next label (inner group bindings will have been undone and are now frozen)
        // true       true        Fail into outer continuations (inner group binding MUST BE CLEARED)

        if (succeeded && begin->isNegation)
        {
            ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
        }

        if (succeeded == begin->isNegation)
        {
            // Assertion failed
            return false;
        }
        else
        {
            // Continue with next label but from original input position
            inputOffset = info->startInputOffset;
            instPointer = LabelToInstPointer(begin->nextLabel);

            return true;
        }
    }